

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextItem(char *str_id,ImGuiMouseButton mouse_button)

{
  char *in_RDI;
  ImGuiID id;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiID in_stack_00000010;
  ImGuiID in_stack_00000034;
  ImGuiID local_28;
  ImGuiWindow *pIVar1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    if (in_RDI == (char *)0x0) {
      local_28 = (pIVar1->DC).LastItemId;
    }
    else {
      local_28 = ImGuiWindow::GetID(unaff_retaddr,
                                    (char *)CONCAT17(in_stack_ffffffffffffffff,
                                                     in_stack_fffffffffffffff8),in_RDI);
    }
    if (local_28 == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1eb5,"bool ImGui::BeginPopupContextItem(const char *, ImGuiMouseButton)");
    }
    bVar2 = IsMouseReleased((ImGuiMouseButton)((ulong)pIVar1 >> 0x20));
    if ((bVar2) && (bVar2 = IsItemHovered((ImGuiHoveredFlags)pIVar1), bVar2)) {
      OpenPopupEx(in_stack_00000034);
    }
    bVar2 = BeginPopupEx(in_stack_00000010,window._4_4_);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiMouseButton mouse_button)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}